

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

void __thiscall
bssl::internal::Deleter::operator()(Deleter *this,MRUQueue<bssl::DTLSSentRecord,_32UL> *ptr)

{
  MRUQueue<bssl::DTLSSentRecord,_32UL> *ptr_local;
  Deleter *this_local;
  
  DeleterImpl<bssl::MRUQueue<bssl::DTLSSentRecord,_32UL>,_void>::Free(ptr);
  return;
}

Assistant:

void operator()(T *ptr) {
    // Rather than specialize Deleter for each type, we specialize
    // DeleterImpl. This allows bssl::UniquePtr<T> to be used while only
    // including base.h as long as the destructor is not emitted. This matches
    // std::unique_ptr's behavior on forward-declared types.
    //
    // DeleterImpl itself is specialized in the corresponding module's header
    // and must be included to release an object. If not included, the compiler
    // will error that DeleterImpl<T> does not have a method Free.
    DeleterImpl<T>::Free(ptr);
  }